

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int xar_write_header(archive_write *a,archive_entry *entry)

{
  chksumwork_conflict *sumwrk;
  void *buff;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  archive_entry *paVar4;
  archive_string *dest;
  int iVar5;
  int iVar6;
  mode_t mVar7;
  mode_t mVar8;
  uint uVar9;
  wchar_t wVar10;
  archive_string_conv *paVar11;
  file_conflict *file;
  char *pcVar12;
  file_conflict *pfVar13;
  char *pcVar14;
  archive_rb_node *paVar15;
  __off_t _Var16;
  heap_data *__ptr;
  uint64_t uVar17;
  la_int64_t lVar18;
  int *piVar19;
  uint uVar20;
  archive_entry **extraout_RDX;
  archive_entry **fn;
  char *pathname;
  char *fn_00;
  ulong uVar21;
  archive_entry **__s2;
  file_conflict *parent;
  archive_entry **ppaVar22;
  bool bVar23;
  size_t local_178;
  int *local_170;
  void *value;
  size_t sStack_160;
  size_t local_158;
  archive_entry *local_150;
  archive_string *local_148;
  archive_entry **local_140;
  char name [256];
  
  piVar19 = (int *)a->format_data;
  piVar19[0x10] = 0;
  piVar19[0x11] = 0;
  piVar19[0x12] = 0;
  piVar19[0x13] = 0;
  if (*(long *)(piVar19 + 0x46) == 0) {
    paVar11 = archive_string_conversion_to_charset(&a->archive,"UTF-8",L'\x01');
    *(archive_string_conv **)(piVar19 + 0x46) = paVar11;
    if (paVar11 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  file = file_new(a,entry);
  if (file == (file_conflict *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate data");
    return -0x1e;
  }
  iVar5 = file_gen_utility_names(a,file);
  if (iVar5 < -0x14) {
    return iVar5;
  }
  sVar2 = (file->parentdir).length;
  if (sVar2 == 0) {
    if ((file->basename).length == 0) {
      file_free(file);
      return iVar5;
    }
    local_150 = file->entry;
    __s2 = (archive_entry **)0x17cb75;
  }
  else {
    local_150 = file->entry;
    __s2 = (archive_entry **)(file->parentdir).s;
  }
  fn = &file->entry;
  pvVar3 = a->format_data;
  parent = *(file_conflict **)((long)pvVar3 + 0x18);
  local_148 = (archive_string *)((long)pvVar3 + 0x28);
  ppaVar22 = __s2;
  local_170 = piVar19;
  local_140 = fn;
  if ((*(size_t *)((long)pvVar3 + 0x30) != sVar2) ||
     (iVar6 = strcmp(local_148->s,(char *)__s2), fn = extraout_RDX, iVar6 != 0)) {
    while( true ) {
      uVar9 = get_path_component(name,(int)ppaVar22,(char *)fn);
      uVar21 = (ulong)uVar9;
      if (uVar9 == 0) break;
      if ((int)uVar9 < 0) goto LAB_0015ebb2;
      pfVar13 = (file_conflict *)__archive_rb_tree_find_node(&parent->rbtree,name);
      if (pfVar13 == (file_conflict *)0x0) break;
      if (*(char *)ppaVar22 == '\0') goto LAB_0015ebf6;
      if ((pfVar13->field_0x168 & 2) == 0) {
        pcVar14 = archive_entry_pathname(pfVar13->entry);
        pcVar12 = archive_entry_pathname(file->entry);
        archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar14,
                          pcVar12);
        goto LAB_0015ec5e;
      }
      fn = (archive_entry **)((long)ppaVar22 + (*(char *)((long)ppaVar22 + uVar21) == '/') + uVar21)
      ;
      parent = pfVar13;
      ppaVar22 = fn;
    }
    do {
      dest = local_148;
      if (*(char *)ppaVar22 == '\0') goto LAB_0015eb4c;
      value = (void *)0x0;
      sStack_160 = 0;
      local_158 = 0;
      archive_strncat((archive_string *)&value,__s2,(size_t)((long)ppaVar22 + (uVar21 - (long)__s2))
                     );
      if (*(char *)((long)value + (sStack_160 - 1)) == '/') {
        *(undefined1 *)((long)value + (sStack_160 - 1)) = 0;
        sStack_160 = sStack_160 - 1;
      }
      pfVar13 = file_create_virtual_dir(a,(xar_conflict *)value,pathname);
      archive_string_free((archive_string *)&value);
      if (pfVar13 == (file_conflict *)0x0) {
        pcVar14 = "Can\'t allocate memory";
        iVar5 = 0xc;
        goto LAB_0015ebc1;
      }
      iVar6 = file_gen_utility_names(a,pfVar13);
      if (iVar6 < -0x18) {
        return -0x1e;
      }
      file_add_child_tail(parent,pfVar13);
      iVar6 = *(int *)((long)pvVar3 + 0x10);
      *(int *)((long)pvVar3 + 0x10) = iVar6 + 1;
      pfVar13->id = iVar6;
      pfVar13->next = (file_conflict *)0x0;
      **(undefined8 **)((long)pvVar3 + 0x101b0) = pfVar13;
      *(file_conflict ***)((long)pvVar3 + 0x101b0) = &pfVar13->next;
      ppaVar22 = (archive_entry **)
                 ((long)ppaVar22 + (*(char *)((long)ppaVar22 + uVar21) == '/') + uVar21);
      uVar9 = get_path_component(name,(int)ppaVar22,fn_00);
      if ((int)uVar9 < 0) {
        archive_string_free((archive_string *)&value);
LAB_0015ebb2:
        pcVar14 = "A name buffer is too small";
        iVar5 = -1;
LAB_0015ebc1:
        archive_set_error(&a->archive,iVar5,pcVar14);
        file_free(file);
        return -0x1e;
      }
      uVar21 = (ulong)uVar9;
      parent = pfVar13;
    } while( true );
  }
  iVar6 = file_add_child_tail(*(file_conflict **)((long)pvVar3 + 0x20),file);
  if (iVar6 == 0) {
    pfVar13 = (file_conflict *)
              __archive_rb_tree_find_node
                        ((archive_rb_tree *)(*(long *)((long)pvVar3 + 0x20) + 0x28),
                         (file->basename).s);
    goto LAB_0015ebf6;
  }
LAB_0015ecb6:
  piVar19 = local_170;
  if (file->entry != local_150) {
    return iVar5;
  }
  if (file->id == 0) {
    iVar6 = local_170[4];
    local_170[4] = iVar6 + 1;
    file->id = iVar6;
    file->next = (file_conflict *)0x0;
    **(undefined8 **)(local_170 + 0x406c) = file;
    *(file_conflict ***)(local_170 + 0x406c) = &file->next;
  }
  if ((file->field_0x168 & 1) != 0) {
    return iVar5;
  }
  if (*local_170 == -1) {
    local_170[2] = 0;
    local_170[3] = 0;
    uVar9 = 0;
    iVar6 = __archive_mktemp((char *)0x0);
    *piVar19 = iVar6;
    if (iVar6 < 0) {
      piVar19 = __errno_location();
      iVar5 = *piVar19;
      pcVar14 = "Couldn\'t create temporary file";
      goto LAB_0015f1eb;
    }
    iVar1 = piVar19[0x20];
    if (iVar1 == 1) {
      uVar9 = 0x14;
    }
    uVar20 = 0x10;
    if (iVar1 != 2) {
      uVar20 = uVar9;
    }
    if (uVar20 != 0) {
      _Var16 = lseek(iVar6,(ulong)uVar20,0);
      if (_Var16 < 0) {
        piVar19 = __errno_location();
        iVar5 = *piVar19;
        pcVar14 = "lseek failed";
        goto LAB_0015f1eb;
      }
      *(ulong *)(local_170 + 2) = (ulong)uVar20;
    }
  }
  pcVar14 = archive_entry_hardlink(file->entry);
  if (pcVar14 == (char *)0x0) {
    pvVar3 = a->format_data;
    wVar10 = archive_entry_xattr_reset(file->entry);
    if (wVar10 != L'\0') {
      sumwrk = (chksumwork_conflict *)((long)pvVar3 + 0x98);
      local_150 = (archive_entry *)((long)pvVar3 + 0xb0);
      buff = (void *)((long)pvVar3 + 0x120);
      while (bVar23 = wVar10 != L'\0', wVar10 = wVar10 + L'\xffffffff', bVar23) {
        archive_entry_xattr_next(file->entry,(char **)name,&value,&local_178);
        checksum_init(sumwrk,*(sumalg *)((long)pvVar3 + 0x84));
        paVar4 = local_150;
        checksum_init((chksumwork_conflict *)local_150,*(sumalg *)((long)pvVar3 + 0x84));
        __ptr = (heap_data *)calloc(1,0x80);
        if (__ptr == (heap_data *)0x0) {
          pcVar14 = "Can\'t allocate memory for xattr";
          goto LAB_0015f1e8;
        }
        iVar6 = file->ea_idx;
        file->ea_idx = iVar6 + 1;
        __ptr->id = iVar6;
        __ptr->temp_offset = *(uint64_t *)((long)pvVar3 + 8);
        __ptr->size = local_178;
        __ptr->compression = *(enctype *)((long)pvVar3 + 0x88);
        checksum_update((chksumwork_conflict *)paVar4,value,local_178);
        checksum_final((chksumwork_conflict *)paVar4,&__ptr->e_sum);
        if (__ptr->compression == NONE) {
          checksum_update(sumwrk,value,local_178);
          checksum_final(sumwrk,&__ptr->a_sum);
          iVar6 = write_to_temp(a,value,local_178);
          if (iVar6 != 0) {
LAB_0015f0be:
            free(__ptr);
            return -0x1e;
          }
          __ptr->length = local_178;
          __ptr->next = (heap_data *)0x0;
          *(file->xattr).last = __ptr;
          (file->xattr).last = &__ptr->next;
        }
        else {
          iVar6 = xar_compression_init_encoder(a);
          if (iVar6 != 0) goto LAB_0015f0be;
          *(void **)((long)pvVar3 + 200) = value;
          *(size_t *)((long)pvVar3 + 0xd0) = local_178;
          while( true ) {
            if (*(int *)((long)pvVar3 + 0xf8) == 0) {
              uVar9 = 0;
            }
            else {
              uVar9 = (**(code **)((long)pvVar3 + 0x108))(a,(long)pvVar3 + 200,0);
              if (1 < uVar9) goto LAB_0015f0be;
            }
            local_178 = 0x10000 - *(long *)((long)pvVar3 + 0xe8);
            checksum_update(sumwrk,buff,local_178);
            iVar6 = write_to_temp(a,buff,local_178);
            if (iVar6 != 0) goto LAB_0015f0be;
            if (uVar9 != 0) break;
            *(void **)((long)pvVar3 + 0xe0) = buff;
            *(undefined8 *)((long)pvVar3 + 0xe8) = 0x10000;
          }
          checksum_final(sumwrk,&__ptr->a_sum);
          __ptr->length = *(uint64_t *)((long)pvVar3 + 0xf0);
          __ptr->next = (heap_data *)0x0;
          *(file->xattr).last = __ptr;
          (file->xattr).last = &__ptr->next;
          if ((*(int *)((long)pvVar3 + 0xf8) != 0) &&
             (iVar6 = (**(code **)((long)pvVar3 + 0x110))(a,(long)pvVar3 + 200), iVar6 != 0)) {
            return -0x1e;
          }
        }
      }
    }
  }
  mVar8 = archive_entry_filetype(file->entry);
  if (mVar8 != 0x8000) {
    return iVar5;
  }
  *(file_conflict **)(local_170 + 0x10) = file;
  uVar9 = archive_entry_nlink(file->entry);
  if (1 < uVar9) {
    pvVar3 = a->format_data;
    archive_entry_set_nlink(file->entry,1);
    pcVar14 = archive_entry_hardlink(file->entry);
    if (pcVar14 == (char *)0x0) {
      paVar15 = (archive_rb_node *)malloc(0x30);
      if (paVar15 == (archive_rb_node *)0x0) {
        pcVar14 = "Can\'t allocate memory";
LAB_0015f1e8:
        iVar5 = 0xc;
LAB_0015f1eb:
        archive_set_error(&a->archive,iVar5,pcVar14);
        return -0x1e;
      }
      *(undefined4 *)paVar15[1].rb_nodes = 1;
      file->hlnext = (file_conflict *)0x0;
      paVar15[1].rb_nodes[1] = &file->rbnode;
      paVar15[1].rb_info = (uintptr_t)&file->hlnext;
      __archive_rb_tree_insert_node((archive_rb_tree *)((long)pvVar3 + 0x101b8),paVar15);
    }
    else {
      paVar15 = __archive_rb_tree_find_node((archive_rb_tree *)((long)pvVar3 + 0x101b8),pcVar14);
      if (paVar15 != (archive_rb_node *)0x0) {
        file->hlnext = (file_conflict *)0x0;
        *(file_conflict **)paVar15[1].rb_info = file;
        paVar15[1].rb_info = (uintptr_t)&file->hlnext;
        *(int *)paVar15[1].rb_nodes = *(int *)paVar15[1].rb_nodes + 1;
      }
      archive_entry_unset_size(file->entry);
    }
    pcVar14 = archive_entry_hardlink(file->entry);
    if (pcVar14 != (char *)0x0) {
      archive_entry_unset_size(file->entry);
      return iVar5;
    }
  }
  piVar19 = local_170;
  (file->data).temp_offset = *(uint64_t *)(local_170 + 2);
  uVar17 = archive_entry_size(file->entry);
  (file->data).size = uVar17;
  (file->data).compression = piVar19[0x22];
  lVar18 = archive_entry_size(file->entry);
  *(la_int64_t *)(piVar19 + 0x12) = lVar18;
  checksum_init((chksumwork_conflict *)(piVar19 + 0x26),piVar19[0x21]);
  checksum_init((chksumwork_conflict *)(piVar19 + 0x2c),piVar19[0x21]);
  iVar6 = xar_compression_init_encoder(a);
  if (iVar6 != 0) {
    return iVar6;
  }
  return iVar5;
LAB_0015eb4c:
  *(file_conflict **)((long)pvVar3 + 0x20) = parent;
  *(undefined8 *)((long)pvVar3 + 0x30) = 0;
  archive_string_ensure(local_148,(parent->parentdir).length + (parent->basename).length + 2);
  sVar2 = (parent->parentdir).length;
  if ((parent->basename).length + sVar2 == 0) {
    *dest->s = '\0';
  }
  else {
    if (sVar2 != 0) {
      *(undefined8 *)((long)pvVar3 + 0x30) = 0;
      archive_string_concat(dest,&parent->parentdir);
      archive_strappend_char(dest,'/');
    }
    archive_string_concat(dest,&parent->basename);
  }
  iVar6 = file_add_child_tail(parent,file);
  if (iVar6 == 0) {
    pfVar13 = (file_conflict *)__archive_rb_tree_find_node(&parent->rbtree,(file->basename).s);
LAB_0015ebf6:
    mVar8 = archive_entry_filetype(pfVar13->entry);
    mVar7 = archive_entry_filetype(*local_140);
    paVar4 = pfVar13->entry;
    if (mVar8 != mVar7) {
      pcVar14 = archive_entry_pathname(paVar4);
      archive_set_error(&a->archive,-1,
                        "Found duplicate entries `%s\' and its file type is different",pcVar14);
LAB_0015ec5e:
      file_free(file);
      return -0x19;
    }
    pfVar13->entry = file->entry;
    file->entry = paVar4;
    pfVar13->field_0x168 = pfVar13->field_0x168 & 0xfe;
    file_free(file);
    file = pfVar13;
  }
  goto LAB_0015ecb6;
}

Assistant:

static int
xar_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct file *file;
	struct archive_entry *file_entry;
	int r, r2;

	xar = (struct xar *)a->format_data;
	xar->cur_file = NULL;
	xar->bytes_remaining = 0;

	if (xar->sconv == NULL) {
		xar->sconv = archive_string_conversion_to_charset(
		    &a->archive, "UTF-8", 1);
		if (xar->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	file = file_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r2 = file_gen_utility_names(a, file);
	if (r2 < ARCHIVE_WARN)
		return (r2);

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an Xar archive.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		file_free(file);
		return (r2);
	}

	/* Add entry into tree */
	file_entry = file->entry;
	r = file_tree(a, &file);
	if (r != ARCHIVE_OK)
		return (r);
	/* There is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (file->entry != file_entry)
		return (r2);
	if (file->id == 0)
		file_register(xar, file);

	/* A virtual file, which is a directory, does not have
	 * any contents and we won't store it into a archive
	 * file other than its name. */
	if (file->virtual)
		return (r2);

	/*
	 * Prepare to save the contents of the file.
	 */
	if (xar->temp_fd == -1) {
		int algsize;
		xar->temp_offset = 0;
		xar->temp_fd = __archive_mktemp(NULL);
		if (xar->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
		algsize = getalgsize(xar->opt_toc_sumalg);
		if (algsize > 0) {
			if (lseek(xar->temp_fd, algsize, SEEK_SET) < 0) {
				archive_set_error(&(a->archive), errno,
				    "lseek failed");
				return (ARCHIVE_FATAL);
			}
			xar->temp_offset = algsize;
		}
	}

	if (archive_entry_hardlink(file->entry) == NULL) {
		r = save_xattrs(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Non regular files contents are unneeded to be saved to
	 * a temporary file. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (r2);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	xar->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = file_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (r);
		if (archive_entry_hardlink(file->entry) != NULL) {
			archive_entry_unset_size(file->entry);
			return (r2);
		}
	}

	/* Save a offset of current file in temporary file. */
	file->data.temp_offset = xar->temp_offset;
	file->data.size = archive_entry_size(file->entry);
	file->data.compression = xar->opt_compression;
	xar->bytes_remaining = archive_entry_size(file->entry);
	checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
	checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);
	r = xar_compression_init_encoder(a);

	if (r != ARCHIVE_OK)
		return (r);
	else
		return (r2);
}